

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::InternalSwap
          (FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  FieldDescriptorProto *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__a;
  long in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_fffffffffffffe48;
  InternalMetadataWithArena *in_stack_fffffffffffffe50;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_fffffffffffffe80;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_004fbecf;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_stack_fffffffffffffe80);
  }
  internal::InternalMetadataWithArena::DoSwap(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
LAB_004fbecf:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 0x10));
  this_01 = (FieldDescriptorProto *)(in_RDI + 0x18);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x18));
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x20));
  __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x28);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            (__a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (in_RSI + 0x28));
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x30));
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x38),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x38));
  std::swap<google::protobuf::FieldOptions*>
            ((FieldOptions **)(in_RDI + 0x40),(FieldOptions **)(in_RSI + 0x40));
  std::swap<int>((int *)(in_RDI + 0x48),(int *)(in_RSI + 0x48));
  std::swap<int>((int *)(in_RDI + 0x4c),(int *)(in_RSI + 0x4c));
  std::swap<int>((int *)(in_RDI + 0x50),(int *)(in_RSI + 0x50));
  std::swap<int>((int *)(in_RDI + 0x54),(int *)(in_RSI + 0x54));
  return;
}

Assistant:

void FieldDescriptorProto::InternalSwap(FieldDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  extendee_.Swap(&other->extendee_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  type_name_.Swap(&other->type_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  default_value_.Swap(&other->default_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  json_name_.Swap(&other->json_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(number_, other->number_);
  swap(oneof_index_, other->oneof_index_);
  swap(label_, other->label_);
  swap(type_, other->type_);
}